

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

void wasm::TypeUpdating::handleNonDefaultableLocals(Function *func,Module *wasm)

{
  undefined4 uVar1;
  uint index_00;
  pointer pTVar2;
  LocalGet *get;
  LocalSet *this;
  ulong uVar3;
  void *pvVar4;
  pointer pppEVar5;
  bool bVar6;
  __buckets_ptr pp_Var7;
  Type *pTVar8;
  Type TVar9;
  _Base_ptr p_Var10;
  const_iterator cVar11;
  Expression *pEVar12;
  RefAs *pRVar13;
  TupleExtract *this_00;
  TupleMake *right;
  Block *pBVar14;
  size_t sVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  char *__function;
  Builder BVar18;
  pointer pTVar19;
  size_t sVar20;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var21;
  optional<wasm::Type> type_00;
  undefined1 local_120 [8];
  LocalStructuralDominance info;
  undefined1 local_d0 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  badIndexes;
  Type local_88;
  Type type;
  uint index;
  pointer local_70;
  FindAllPointers<wasm::LocalGet> local_68;
  Builder local_50;
  Builder builder;
  
  if (((wasm->features).features & 0x100) != 0) {
    pTVar19 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start;
    pTVar2 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar19 != pTVar2) {
      bVar6 = false;
      builder.wasm = wasm;
LAB_00739744:
      do {
        local_120 = (undefined1  [8])pTVar19->id;
        badIndexes._M_h._M_buckets = (__buckets_ptr)0x0;
        local_d0 = (undefined1  [8])local_120;
        pp_Var7 = (__buckets_ptr)wasm::Type::size((Type *)local_120);
        if (badIndexes._M_h._M_buckets == pp_Var7) goto LAB_007397bc;
        do {
          do {
            pTVar8 = wasm::Type::Iterator::operator*((Iterator *)local_d0);
            if (6 < pTVar8->id && (pTVar8->id & 3) == 0) {
              pTVar19 = pTVar19 + 1;
              bVar6 = true;
              if (pTVar19 != pTVar2) goto LAB_00739744;
              goto LAB_007397ea;
            }
            badIndexes._M_h._M_buckets = (__buckets_ptr)((long)badIndexes._M_h._M_buckets + 1);
          } while (badIndexes._M_h._M_buckets != pp_Var7);
LAB_007397bc:
        } while (local_d0 != (undefined1  [8])local_120);
        pTVar19 = pTVar19 + 1;
      } while (pTVar19 != pTVar2);
      if (bVar6) {
LAB_007397ea:
        puVar16 = (undefined8 *)0x0;
        LocalStructuralDominance::LocalStructuralDominance
                  ((LocalStructuralDominance *)local_120,func,builder.wasm,NonNullableOnly);
        local_d0 = (undefined1  [8])&badIndexes._M_h._M_rehash_policy._M_next_resize;
        badIndexes._M_h._M_buckets = (__buckets_ptr)0x1;
        badIndexes._M_h._M_bucket_count = 0;
        badIndexes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        badIndexes._M_h._M_element_count._0_4_ = 0x3f800000;
        badIndexes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        badIndexes._M_h._M_rehash_policy._4_4_ = 0;
        badIndexes._M_h._M_rehash_policy._M_next_resize = 0;
        if (info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Rb_tree_node_base *)&info) {
          p_Var10 = info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          do {
            type.id._0_4_ = p_Var10[1]._M_color;
            local_68.list.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_d0;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_d0,&type,&local_68);
            TVar9 = Function::getLocalType(func,(_Rb_tree_color)type.id);
            puVar16 = (undefined8 *)CONCAT71((int7)((ulong)puVar16 >> 8),6 < TVar9.id);
            if ((6 >= TVar9.id || (TVar9.id & 3) != 0) &&
               ((TVar9 = Function::getLocalType(func,(_Rb_tree_color)type.id), TVar9.id < 7 ||
                ((TVar9.id & 1) == 0)))) {
              __assert_fail("func->getLocalType(index).isNonNullable() || func->getLocalType(index).isTuple()"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                            ,0x199,
                            "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)"
                           );
            }
            bVar6 = Function::isParam(func,(_Rb_tree_color)type.id);
            if (bVar6) {
              __assert_fail("!func->isParam(index)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                            ,0x19a,
                            "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)"
                           );
            }
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
            BVar18 = builder;
          } while (p_Var10 != (_Rb_tree_node_base *)&info);
          if (badIndexes._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
            local_50.wasm = builder.wasm;
            FindAllPointers<wasm::LocalGet>::FindAllPointers(&local_68,&func->body);
            pppEVar5 = local_68.list.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (local_68.list.
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_68.list.
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              p_Var21 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         *)local_68.list.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              do {
                puVar17 = *(undefined8 **)p_Var21;
                get = (LocalGet *)*puVar17;
                if ((get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id !=
                    LocalGetId) {
                  __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
                  goto LAB_00739d2f;
                }
                cVar11 = std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)local_d0,&get->index);
                if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  pEVar12 = fixLocalGet(get,builder.wasm);
                  *puVar17 = pEVar12;
                }
                p_Var21 = p_Var21 + 8;
                BVar18.wasm = builder.wasm;
              } while (p_Var21 !=
                       (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)pppEVar5);
            }
            if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)local_68.list.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_start !=
                (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)0x0) {
              operator_delete(local_68.list.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_68.list.
                                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_68.list.
                                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            FindAllPointers<wasm::LocalSet>::FindAllPointers
                      ((FindAllPointers<wasm::LocalSet> *)&local_68,&func->body);
            for (p_Var21 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_68.list.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                p_Var21 !=
                (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)local_68.list.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_finish; p_Var21 = p_Var21 + 8) {
              puVar17 = *(undefined8 **)p_Var21;
              this = (LocalSet *)*puVar17;
              if ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
                  LocalSetId) {
                __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
LAB_00739d2f:
                __assert_fail("int(_id) == int(T::SpecificId)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                              ,0x31b,__function);
              }
              bVar6 = Function::isVar(func,this->index);
              if (((bVar6) && (bVar6 = LocalSet::isTee(this), bVar6)) &&
                 ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id
                  != 1)) {
                badIndexes._M_h._M_single_bucket = (__node_base_ptr)&this->index;
                cVar11 = std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)local_d0,(key_type *)badIndexes._M_h._M_single_bucket);
                if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  local_88 = Function::getLocalType
                                       (func,*(Index *)&(badIndexes._M_h._M_single_bucket)->_M_nxt);
                  TVar9 = getValidLocalType(local_88,(FeatureSet)((BVar18.wasm)->features).features)
                  ;
                  puVar16 = (undefined8 *)CONCAT71((int7)((ulong)puVar16 >> 8),local_88.id < 7);
                  if ((local_88.id & 1) != 0 || local_88.id < 7) {
                    if ((local_88.id < 7) || ((local_88.id & 1) == 0)) {
                      __assert_fail("type.isTuple()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                                    ,0x1bd,
                                    "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)"
                                   );
                    }
                    LocalSet::makeSet(this);
                    sVar15 = wasm::Type::size(&local_88);
                    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &type,sVar15,
                               (allocator_type *)
                               &info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                    sVar15 = wasm::Type::size(&local_88);
                    if (sVar15 != 0) {
                      sVar20 = 0;
                      do {
                        uVar1 = *(undefined4 *)&(badIndexes._M_h._M_single_bucket)->_M_nxt;
                        pEVar12 = (Expression *)
                                  MixedArena::allocSpace(&(local_50.wasm)->allocator,0x18,8);
                        pEVar12->_id = LocalGetId;
                        *(undefined4 *)(pEVar12 + 1) = uVar1;
                        (pEVar12->type).id = TVar9.id;
                        this_00 = (TupleExtract *)
                                  MixedArena::allocSpace(&(local_50.wasm)->allocator,0x20,8);
                        (this_00->super_SpecificExpression<(wasm::Expression::Id)58>).
                        super_Expression._id = TupleExtractId;
                        (this_00->super_SpecificExpression<(wasm::Expression::Id)58>).
                        super_Expression.type.id = 0;
                        this_00->tuple = pEVar12;
                        this_00->index = (Index)sVar20;
                        TupleExtract::finalize(this_00);
                        *(TupleExtract **)
                         (CONCAT44(type.id._4_4_,(_Rb_tree_color)type.id) + sVar20 * 8) = this_00;
                        info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count =
                             (size_t)&local_88;
                        pTVar8 = wasm::Type::Iterator::operator*
                                           ((Iterator *)
                                            &info.nonDominatingIndices._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count);
                        uVar3 = pTVar8->id;
                        puVar16 = (undefined8 *)CONCAT71((int7)((ulong)puVar16 >> 8),uVar3 < 7);
                        if ((uVar3 & 3) == 0 && uVar3 >= 7) {
                          pEVar12 = *(Expression **)
                                     (CONCAT44(type.id._4_4_,(_Rb_tree_color)type.id) + sVar20 * 8);
                          pRVar13 = (RefAs *)MixedArena::allocSpace
                                                       (&(local_50.wasm)->allocator,0x20,8);
                          (pRVar13->super_SpecificExpression<(wasm::Expression::Id)81>).
                          super_Expression._id = RefAsId;
                          (pRVar13->super_SpecificExpression<(wasm::Expression::Id)81>).
                          super_Expression.type.id = 0;
                          pRVar13->op = RefAsNonNull;
                          pRVar13->value = pEVar12;
                          RefAs::finalize(pRVar13);
                          *(RefAs **)(CONCAT44(type.id._4_4_,(_Rb_tree_color)type.id) + sVar20 * 8)
                               = pRVar13;
                        }
                        sVar20 = sVar20 + 1;
                      } while (sVar15 != sVar20);
                    }
                    right = Builder::
                            makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                      (&local_50,
                                       (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        *)&type);
                    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_payload =
                         (_Storage<wasm::Type,_true>)puVar16;
                    pBVar14 = Builder::makeSequence
                                        (&local_50,(Expression *)this,(Expression *)right,type_00);
                    BVar18 = builder;
                    *puVar17 = pBVar14;
                    pvVar4 = (void *)CONCAT44(type.id._4_4_,(_Rb_tree_color)type.id);
                    puVar16 = puVar17;
                    if (pvVar4 != (void *)0x0) {
                      operator_delete(pvVar4,(long)local_70 - (long)pvVar4);
                      puVar16 = puVar17;
                    }
                  }
                  else {
                    (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.
                    id = TVar9.id;
                    pRVar13 = (RefAs *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x20,8);
                    (pRVar13->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.
                    _id = RefAsId;
                    (pRVar13->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.
                    type.id = 0;
                    pRVar13->op = RefAsNonNull;
                    pRVar13->value = (Expression *)this;
                    RefAs::finalize(pRVar13);
                    *puVar17 = pRVar13;
                  }
                }
              }
            }
            puVar16 = (undefined8 *)badIndexes._M_h._M_bucket_count;
            if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)local_68.list.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_start !=
                (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)0x0) {
              operator_delete(local_68.list.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_68.list.
                                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_68.list.
                                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              puVar16 = (undefined8 *)badIndexes._M_h._M_bucket_count;
            }
            for (; puVar16 != (undefined8 *)0x0; puVar16 = (undefined8 *)*puVar16) {
              index_00 = *(uint *)(puVar16 + 1);
              TVar9 = Function::getLocalType(func,index_00);
              TVar9 = getValidLocalType(TVar9,(FeatureSet)((BVar18.wasm)->features).features);
              sVar15 = Function::getNumParams(func);
              (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start[index_00 - sVar15].id = TVar9.id;
            }
          }
        }
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_d0);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_120);
      }
    }
  }
  return;
}

Assistant:

void handleNonDefaultableLocals(Function* func, Module& wasm) {
  if (!wasm.features.hasReferenceTypes()) {
    // No references, so no non-nullable ones at all.
    return;
  }
  bool hasNonNullable = false;
  for (auto varType : func->vars) {
    for (auto type : varType) {
      if (type.isNonNullable()) {
        hasNonNullable = true;
        break;
      }
    }
  }
  if (!hasNonNullable) {
    // No non-nullable types exist in practice.
    return;
  }

  // Non-nullable locals exist, which we may need to fix up. See if they
  // validate as they are, that is, if they fall within the validation rules of
  // the wasm spec. We do not need to modify such locals.
  LocalStructuralDominance info(
    func, wasm, LocalStructuralDominance::NonNullableOnly);
  std::unordered_set<Index> badIndexes;
  for (auto index : info.nonDominatingIndices) {
    badIndexes.insert(index);

    // LocalStructuralDominance should have only looked at non-nullable indexes
    // since we told it to ignore nullable ones. Also, params always dominate
    // and should not appear here.
    assert(func->getLocalType(index).isNonNullable() ||
           func->getLocalType(index).isTuple());
    assert(!func->isParam(index));
  }
  if (badIndexes.empty()) {
    return;
  }

  // Rewrite the local.gets.
  Builder builder(wasm);
  for (auto** getp : FindAllPointers<LocalGet>(func->body).list) {
    auto* get = (*getp)->cast<LocalGet>();
    if (badIndexes.count(get->index)) {
      *getp = fixLocalGet(get, wasm);
    }
  }

  // Update tees, whose type must match the local (if the wasm spec changes for
  // the type to be that of the value, then this can be removed).
  for (auto** setp : FindAllPointers<LocalSet>(func->body).list) {
    auto* set = (*setp)->cast<LocalSet>();
    if (!func->isVar(set->index)) {
      // We do not need to process params, which can legally be non-nullable.
      continue;
    }
    // Non-tees do not change, and unreachable tees can be ignored here as their
    // type is unreachable anyhow.
    if (!set->isTee() || set->type == Type::unreachable) {
      continue;
    }
    if (badIndexes.count(set->index)) {
      auto type = func->getLocalType(set->index);
      auto validType = getValidLocalType(type, wasm.features);
      if (type.isRef()) {
        set->type = validType;
        *setp = builder.makeRefAs(RefAsNonNull, set);
      } else {
        assert(type.isTuple());
        set->makeSet();
        std::vector<Expression*> elems(type.size());
        for (size_t i = 0, size = type.size(); i < size; ++i) {
          elems[i] = builder.makeTupleExtract(
            builder.makeLocalGet(set->index, validType), i);
          if (type[i].isNonNullable()) {
            elems[i] = builder.makeRefAs(RefAsNonNull, elems[i]);
          }
        }
        *setp =
          builder.makeSequence(set, builder.makeTupleMake(std::move(elems)));
      }
    }
  }

  // Rewrite the types of the function's vars (which we can do now, after we
  // are done using them to know which local.gets etc to fix).
  for (auto index : badIndexes) {
    func->vars[index - func->getNumParams()] =
      getValidLocalType(func->getLocalType(index), wasm.features);
  }
}